

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O0

vector<duckdb::PartitionStatistics,_true> * __thiscall
duckdb::RowGroupCollection::GetPartitionStats(RowGroupCollection *this)

{
  bool bVar1;
  RowGroup *this_00;
  RowGroup *this_01;
  vector<duckdb::PartitionStatistics,_true> *in_RDI;
  RowGroup *row_group;
  SegmentIterator __end1;
  SegmentIterator __begin1;
  SegmentIterationHelper *__range1;
  vector<duckdb::PartitionStatistics,_true> *result;
  SegmentTree<duckdb::RowGroup,_true> *in_stack_ffffffffffffff28;
  shared_ptr<duckdb::RowGroupSegmentTree,_true> *in_stack_ffffffffffffff30;
  SegmentIterator local_58;
  SegmentIterator local_48 [2];
  SegmentTree<duckdb::RowGroup,_true> *local_28;
  SegmentTree<duckdb::RowGroup,_true> **local_20;
  undefined1 local_11;
  
  local_11 = 0;
  vector<duckdb::PartitionStatistics,_true>::vector
            ((vector<duckdb::PartitionStatistics,_true> *)0xbb331e);
  shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(in_stack_ffffffffffffff30);
  local_28 = (SegmentTree<duckdb::RowGroup,_true> *)
             SegmentTree<duckdb::RowGroup,_true>::Segments(in_stack_ffffffffffffff28);
  local_20 = &local_28;
  local_48[0] = SegmentTree<duckdb::RowGroup,_true>::SegmentIterationHelper::begin
                          ((SegmentIterationHelper *)in_stack_ffffffffffffff30);
  this_01 = local_48[0].current;
  local_58 = SegmentTree<duckdb::RowGroup,_true>::SegmentIterationHelper::end
                       ((SegmentIterationHelper *)0xbb33a1);
  while( true ) {
    bVar1 = SegmentTree<duckdb::RowGroup,_true>::SegmentIterationHelper::SegmentIterator::operator!=
                      (local_48,&local_58);
    if (!bVar1) break;
    this_00 = SegmentTree<duckdb::RowGroup,_true>::SegmentIterationHelper::SegmentIterator::
              operator*(local_48);
    RowGroup::GetPartitionStats(this_01);
    ::std::vector<duckdb::PartitionStatistics,_std::allocator<duckdb::PartitionStatistics>_>::
    push_back((vector<duckdb::PartitionStatistics,_std::allocator<duckdb::PartitionStatistics>_> *)
              this_00,(value_type *)in_stack_ffffffffffffff28);
    SegmentTree<duckdb::RowGroup,_true>::SegmentIterationHelper::SegmentIterator::operator++
              ((SegmentIterator *)this_00);
  }
  return in_RDI;
}

Assistant:

vector<PartitionStatistics> RowGroupCollection::GetPartitionStats() const {
	vector<PartitionStatistics> result;
	for (auto &row_group : row_groups->Segments()) {
		result.push_back(row_group.GetPartitionStats());
	}
	return result;
}